

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

int compress(int elen,double *e,double *h)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  iVar3 = elen + -1;
  dVar5 = e[(long)elen + -1];
  for (uVar2 = elen - 2; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    dVar7 = dVar5 + e[uVar2];
    dVar6 = e[uVar2] - (dVar7 - dVar5);
    if ((dVar6 != 0.0) || (dVar5 = dVar7, NAN(dVar6))) {
      lVar4 = (long)iVar3;
      iVar3 = iVar3 + -1;
      h[lVar4] = dVar7;
      dVar5 = dVar6;
    }
  }
  lVar4 = (long)iVar3;
  uVar2 = 0;
  while( true ) {
    lVar1 = lVar4 + 1;
    if (elen <= lVar1) break;
    dVar6 = dVar5 + h[lVar4 + 1];
    dVar7 = dVar5 - (dVar6 - h[lVar4 + 1]);
    lVar4 = lVar1;
    dVar5 = dVar6;
    if ((dVar7 != 0.0) || (NAN(dVar7))) {
      h[uVar2] = dVar7;
      uVar2 = uVar2 + 1;
    }
  }
  h[uVar2] = dVar5;
  return uVar2 + 1;
}

Assistant:

int compress(int elen, REAL *e, REAL *h)
/* e and h may be the same. */
{
  REAL Q, q;
  INEXACT REAL Qnew;
  int eindex, hindex;
  INEXACT REAL bvirt;
  REAL enow, hnow;
  int top, bottom;

  bottom = elen - 1;
  Q = e[bottom];
  for (eindex = elen - 2; eindex >= 0; eindex--) {
    enow = e[eindex];
    Fast_Two_Sum(Q, enow, Qnew, q);
    if (q != 0) {
      h[bottom--] = Qnew;
      Q = q;
    } else {
      Q = Qnew;
    }
  }
  top = 0;
  for (hindex = bottom + 1; hindex < elen; hindex++) {
    hnow = h[hindex];
    Fast_Two_Sum(hnow, Q, Qnew, q);
    if (q != 0) {
      h[top++] = q;
    }
    Q = Qnew;
  }
  h[top] = Q;
  return top + 1;
}